

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

void Curl_conncontrol(connectdata *conn,int ctrl)

{
  bool bVar1;
  _Bool closeit;
  int ctrl_local;
  connectdata *conn_local;
  
  bVar1 = true;
  if ((ctrl != 1) && (bVar1 = false, ctrl == 2)) {
    bVar1 = (conn->handler->flags & 0x200) == 0;
  }
  if (((ctrl != 2) || ((conn->handler->flags & 0x200) == 0)) &&
     ((uint)bVar1 != (*(uint *)&(conn->bits).field_0x4 & 1))) {
    *(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 & 0xfffffffe | (uint)bVar1;
  }
  return;
}

Assistant:

const char *reason
#endif
  )
{
  /* close if a connection, or a stream that isn't multiplexed */
  bool closeit = (ctrl == CONNCTRL_CONNECTION) ||
    ((ctrl == CONNCTRL_STREAM) && !(conn->handler->flags & PROTOPT_STREAM));
  if((ctrl == CONNCTRL_STREAM) &&
     (conn->handler->flags & PROTOPT_STREAM))
    DEBUGF(infof(conn->data, "Kill stream: %s\n", reason));
  else if((bit)closeit != conn->bits.close) {
    DEBUGF(infof(conn->data, "Marked for [%s]: %s\n",
                 closeit?"closure":"keep alive", reason));
    conn->bits.close = closeit; /* the only place in the source code that
                                   should assign this bit */
  }
}